

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int container_shrink_to_fit(container_t *c,uint8_t type)

{
  uint8_t local_19;
  array_container_t *paStack_18;
  uint8_t type_local;
  container_t *c_local;
  
  local_19 = type;
  paStack_18 = (array_container_t *)c;
  paStack_18 = (array_container_t *)container_mutable_unwrap_shared(c,&local_19);
  if (local_19 == '\x01') {
    c_local._4_4_ = 0;
  }
  else if (local_19 == '\x02') {
    c_local._4_4_ = array_container_shrink_to_fit(paStack_18);
  }
  else {
    if (local_19 != '\x03') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1121,"int container_shrink_to_fit(container_t *, uint8_t)");
    }
    c_local._4_4_ = run_container_shrink_to_fit((run_container_t *)paStack_18);
  }
  return c_local._4_4_;
}

Assistant:

static inline int container_shrink_to_fit(
    container_t *c, uint8_t type
){
    c = container_mutable_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return 0;  // no shrinking possible
        case ARRAY_CONTAINER_TYPE:
            return array_container_shrink_to_fit(CAST_array(c));
        case RUN_CONTAINER_TYPE:
            return run_container_shrink_to_fit(CAST_run(c));
    }
    assert(false);
    __builtin_unreachable();
    return 0;  // unreached
}